

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsSat.c
# Opt level: O1

int Abc_NtkAddOneHotness(Mfs_Man_t *p)

{
  int *piVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int Lits [2];
  int local_40;
  int local_3c;
  long local_38;
  
  if (0 < p->pAigWin->vCis->nSize) {
    lVar5 = 1;
    lVar6 = 0;
    do {
      local_38 = lVar6 + 1;
      pVVar3 = p->pAigWin->vCis;
      uVar4 = (ulong)pVVar3->nSize;
      lVar7 = lVar5;
      if (local_38 < (long)uVar4) {
        do {
          if ((int)uVar4 <= lVar6) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          piVar1 = p->pCnf->pVarNums;
          local_40 = piVar1[*(int *)((long)pVVar3->pArray[lVar6] + 0x24)] * 2 + 1;
          local_3c = piVar1[*(int *)((long)pVVar3->pArray[lVar7] + 0x24)] * 2 + 1;
          iVar2 = sat_solver_addclause(p->pSat,&local_40,(lit *)&local_38);
          if (iVar2 == 0) {
            sat_solver_delete(p->pSat);
            p->pSat = (sat_solver *)0x0;
            return 0;
          }
          lVar7 = lVar7 + 1;
          pVVar3 = p->pAigWin->vCis;
          uVar4 = (ulong)(uint)pVVar3->nSize;
        } while ((int)lVar7 < pVVar3->nSize);
      }
      lVar5 = lVar5 + 1;
      lVar6 = local_38;
    } while (local_38 < p->pAigWin->vCis->nSize);
  }
  return 1;
}

Assistant:

int Abc_NtkAddOneHotness( Mfs_Man_t * p )
{
    Aig_Obj_t * pObj1, * pObj2;
    int i, k, Lits[2];
    for ( i = 0; i < Vec_PtrSize(p->pAigWin->vCis); i++ )
    for ( k = i+1; k < Vec_PtrSize(p->pAigWin->vCis); k++ )
    {
        pObj1 = Aig_ManCi( p->pAigWin, i );
        pObj2 = Aig_ManCi( p->pAigWin, k );
        Lits[0] = toLitCond( p->pCnf->pVarNums[pObj1->Id], 1 );
        Lits[1] = toLitCond( p->pCnf->pVarNums[pObj2->Id], 1 );
        if ( !sat_solver_addclause( p->pSat, Lits, Lits+2 ) )
        {
            sat_solver_delete( p->pSat );
            p->pSat = NULL;
            return 0;
        }
    }
    return 1;
}